

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3NameFromToken(sqlite3 *db,Token *pName)

{
  char *z;
  
  if (pName == (Token *)0x0) {
    z = (char *)0x0;
  }
  else {
    z = sqlite3DbStrNDup(db,pName->z,(ulong)pName->n);
    sqlite3Dequote(z);
  }
  return z;
}

Assistant:

SQLITE_PRIVATE char *sqlite3NameFromToken(sqlite3 *db, Token *pName){
  char *zName;
  if( pName ){
    zName = sqlite3DbStrNDup(db, (char*)pName->z, pName->n);
    sqlite3Dequote(zName);
  }else{
    zName = 0;
  }
  return zName;
}